

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcFace::~IfcFace(IfcFace *this,void **vtt)

{
  void **vtt_local;
  IfcFace *this_local;
  
  (this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)*vtt;
  *(void **)((long)&(this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                    _vptr_ObjectHelper +
            (long)(this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                  _vptr_ObjectHelper[-3]) = vtt[0xc];
  *(void **)&(this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 =
       vtt[0xd];
  *(void **)&(this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 =
       vtt[0xe];
  STEP::ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFaceBound>,_1UL,_0UL>::~ListOf
            ((ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFaceBound>,_1UL,_0UL> *)
             &(this->super_IfcTopologicalRepresentationItem).field_0x30);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcFace,_1UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcFace,_1UL> *)
             &(this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
              super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20,
             vtt + 10);
  IfcTopologicalRepresentationItem::~IfcTopologicalRepresentationItem
            (&this->super_IfcTopologicalRepresentationItem,vtt + 1);
  return;
}

Assistant:

IfcFace() : Object("IfcFace") {}